

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

timediff_t Curl_shutdown_timeleft(connectdata *conn,int sockindex,curltime *nowp)

{
  timediff_t tVar1;
  time_t tVar2;
  timediff_t tVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  curltime older;
  curltime cVar7;
  
  lVar6 = (conn->shutdown).start[sockindex].tv_sec;
  if (lVar6 != 0) {
    uVar4 = (conn->shutdown).timeout_ms;
    if (uVar4 == 0) {
      tVar1 = 0;
    }
    else {
      if (nowp == (curltime *)0x0) {
        cVar7 = Curl_now();
        tVar2 = cVar7.tv_sec;
        iVar5 = cVar7.tv_usec;
        uVar4 = (conn->shutdown).timeout_ms;
        lVar6 = (conn->shutdown).start[sockindex].tv_sec;
      }
      else {
        tVar2 = nowp->tv_sec;
        iVar5 = nowp->tv_usec;
      }
      cVar7.tv_usec = iVar5;
      cVar7.tv_sec = tVar2;
      cVar7._12_4_ = 0;
      older.tv_usec = (conn->shutdown).start[sockindex].tv_usec;
      older.tv_sec = lVar6;
      older._12_4_ = 0;
      tVar3 = Curl_timediff(cVar7,older);
      tVar1 = -1;
      if ((ulong)uVar4 - tVar3 != 0) {
        tVar1 = (ulong)uVar4 - tVar3;
      }
    }
    return tVar1;
  }
  return 0;
}

Assistant:

timediff_t Curl_shutdown_timeleft(struct connectdata *conn, int sockindex,
                                  struct curltime *nowp)
{
  struct curltime now;
  timediff_t left_ms;

  if(!conn->shutdown.start[sockindex].tv_sec || !conn->shutdown.timeout_ms)
    return 0; /* not started or no limits */

  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }
  left_ms = conn->shutdown.timeout_ms -
            Curl_timediff(*nowp, conn->shutdown.start[sockindex]);
  return left_ms ? left_ms : -1;
}